

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestMemoryAllocatorTest.cpp
# Opt level: O0

void __thiscall
TEST_TestMemoryAccountant_countDeallocationsPerSizeMultipleAllocations_Test::
TEST_TestMemoryAccountant_countDeallocationsPerSizeMultipleAllocations_Test
          (TEST_TestMemoryAccountant_countDeallocationsPerSizeMultipleAllocations_Test *this)

{
  TEST_TestMemoryAccountant_countDeallocationsPerSizeMultipleAllocations_Test *this_local;
  
  memset(this,0,0x68);
  TEST_GROUP_CppUTestGroupTestMemoryAccountant::TEST_GROUP_CppUTestGroupTestMemoryAccountant
            (&this->super_TEST_GROUP_CppUTestGroupTestMemoryAccountant);
  (this->super_TEST_GROUP_CppUTestGroupTestMemoryAccountant).super_Utest._vptr_Utest =
       (_func_int **)
       &PTR__TEST_TestMemoryAccountant_countDeallocationsPerSizeMultipleAllocations_Test_0040c948;
  return;
}

Assistant:

TEST(TestMemoryAccountant, countDeallocationsPerSizeMultipleAllocations)
{
    accountant.dealloc(8);
    accountant.dealloc(4);
    accountant.dealloc(8);
    LONGS_EQUAL(1, accountant.totalDeallocationsOfSize(4));
    LONGS_EQUAL(2, accountant.totalDeallocationsOfSize(8));
    LONGS_EQUAL(0, accountant.totalDeallocationsOfSize(20));
    LONGS_EQUAL(3, accountant.totalDeallocations());
}